

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

NetAliasSymbol *
slang::ast::NetAliasSymbol::fromSyntax
          (ASTContext *parentContext,NetAliasSyntax *syntax,
          SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  group_type_pointer pgVar1;
  IdentifierNameSyntax *pIVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  byte bVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  size_t __n;
  char *__s1;
  value_type_pointer pbVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  int iVar37;
  uint uVar38;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar39;
  NetAliasSymbol *this;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  size_type __rlen;
  char *pcVar43;
  undefined1 auVar44 [16];
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  byte bVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  byte bVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  byte bVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  byte bVar60;
  size_t pos;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  locator res;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  ASTContext context;
  string_view local_228;
  Compilation *local_218;
  ulong local_210;
  NetType *local_208;
  size_t local_200;
  IdentifierNameSyntax *local_1f8;
  ulong local_1f0;
  NetAliasSyntax *local_1e8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  char *local_1c8;
  size_t local_1c0;
  ulong local_1b8;
  group_type_pointer local_1b0;
  value_type_pointer local_1a8;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> local_1a0 [2];
  locator local_160;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  byte bStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  byte bStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  byte bStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  byte bStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  byte bStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  undefined1 local_128 [136];
  allocator_type local_a0;
  undefined1 local_98 [24];
  value_type_pointer pbStack_80;
  undefined1 local_78 [16];
  ASTContext local_68;
  
  local_128._128_8_ = local_128;
  local_98._0_8_ = 0x3f;
  local_98._8_8_ = 1;
  stack0xffffffffffffff78 = ZEXT816(0x48f470);
  local_78 = (undefined1  [16])0x0;
  local_1e0 = implicitNets;
  local_a0.storage = (Storage *)local_128._128_8_;
  ASTContext::resetFlags(&local_68,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  local_218 = (local_68.scope.ptr)->compilation;
  local_208 = Scope::getDefaultNetType(local_68.scope.ptr);
  local_210 = (syntax->nets).elements._M_extent._M_extent_value + 1;
  if (1 < local_210) {
    local_210 = local_210 >> 1;
    uVar42 = 0;
    local_1e8 = syntax;
    do {
      ppSVar39 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((syntax->nets).elements._M_ptr + uVar42 * 2));
      if (local_208->netKind != Unknown) {
        local_1a0[0].data_ = (pointer)local_1a0[0].firstElement;
        local_1a0[0].len = 0;
        local_1a0[0].cap = 5;
        local_1d0 = uVar42;
        Expression::findPotentiallyImplicitNets(*ppSVar39,&local_68,local_1a0);
        if (local_1a0[0].len != 0) {
          local_1c8 = (char *)((long)local_1a0[0].data_ + local_1a0[0].len * 8);
          pcVar43 = (char *)local_1a0[0].data_;
          do {
            pIVar2 = *(IdentifierNameSyntax **)pcVar43;
            local_228 = parsing::Token::valueText(&pIVar2->identifier);
            local_1f8 = pIVar2;
            local_200 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)&local_a0,&local_228);
            uVar42 = local_200 >> (local_98[0] & 0x3f);
            lVar40 = (local_200 & 0xff) * 4;
            uVar45 = (&UNK_0048f58c)[lVar40];
            uVar46 = (&UNK_0048f58d)[lVar40];
            uVar47 = (&UNK_0048f58e)[lVar40];
            bVar48 = (&UNK_0048f58f)[lVar40];
            local_1a8 = pbStack_80;
            __n = local_228._M_len;
            __s1 = local_228._M_str;
            local_1b8 = (ulong)((uint)local_200 & 7);
            local_1d8 = local_98._8_8_;
            uVar41 = 0;
            local_1b0 = (group_type_pointer)local_98._16_8_;
            uVar49 = uVar45;
            uVar50 = uVar46;
            uVar51 = uVar47;
            bVar52 = bVar48;
            uVar53 = uVar45;
            uVar54 = uVar46;
            uVar55 = uVar47;
            bVar56 = bVar48;
            uVar57 = uVar45;
            uVar58 = uVar46;
            uVar59 = uVar47;
            bVar60 = bVar48;
            local_1c0 = uVar42;
            do {
              pbVar20 = local_1a8;
              pgVar1 = local_1b0 + uVar42;
              local_138 = pgVar1->m[0].n;
              uStack_137 = pgVar1->m[1].n;
              uStack_136 = pgVar1->m[2].n;
              bStack_135 = pgVar1->m[3].n;
              uStack_134 = pgVar1->m[4].n;
              uStack_133 = pgVar1->m[5].n;
              uStack_132 = pgVar1->m[6].n;
              bStack_131 = pgVar1->m[7].n;
              uStack_130 = pgVar1->m[8].n;
              uStack_12f = pgVar1->m[9].n;
              uStack_12e = pgVar1->m[10].n;
              bStack_12d = pgVar1->m[0xb].n;
              uStack_12c = pgVar1->m[0xc].n;
              uStack_12b = pgVar1->m[0xd].n;
              uStack_12a = pgVar1->m[0xe].n;
              bVar3 = pgVar1->m[0xf].n;
              auVar44[0] = -(local_138 == uVar45);
              auVar44[1] = -(uStack_137 == uVar46);
              auVar44[2] = -(uStack_136 == uVar47);
              auVar44[3] = -(bStack_135 == bVar48);
              auVar44[4] = -(uStack_134 == uVar49);
              auVar44[5] = -(uStack_133 == uVar50);
              auVar44[6] = -(uStack_132 == uVar51);
              auVar44[7] = -(bStack_131 == bVar52);
              auVar44[8] = -(uStack_130 == uVar53);
              auVar44[9] = -(uStack_12f == uVar54);
              auVar44[10] = -(uStack_12e == uVar55);
              auVar44[0xb] = -(bStack_12d == bVar56);
              auVar44[0xc] = -(uStack_12c == uVar57);
              auVar44[0xd] = -(uStack_12b == uVar58);
              auVar44[0xe] = -(uStack_12a == uVar59);
              auVar44[0xf] = -(bVar3 == bVar60);
              local_1f0 = uVar42;
              bStack_129 = bVar3;
              uVar21 = uVar45;
              uVar22 = uVar46;
              uVar23 = uVar47;
              bVar24 = bVar48;
              uVar25 = uVar49;
              uVar26 = uVar50;
              uVar27 = uVar51;
              bVar28 = bVar52;
              uVar29 = uVar53;
              uVar30 = uVar54;
              uVar31 = uVar55;
              bVar32 = bVar56;
              uVar33 = uVar57;
              uVar34 = uVar58;
              uVar35 = uVar59;
              bVar36 = bVar60;
              uVar4 = local_148;
              uVar5 = uStack_147;
              uVar6 = uStack_146;
              bVar7 = bStack_145;
              uVar8 = uStack_144;
              uVar9 = uStack_143;
              uVar10 = uStack_142;
              bVar11 = bStack_141;
              uVar12 = uStack_140;
              uVar13 = uStack_13f;
              uVar14 = uStack_13e;
              bVar15 = bStack_13d;
              uVar16 = uStack_13c;
              uVar17 = uStack_13b;
              uVar18 = uStack_13a;
              bVar19 = bStack_139;
              for (uVar38 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
                  bStack_139 = bVar36, uStack_13a = uVar35, uStack_13b = uVar34, uStack_13c = uVar33
                  , bStack_13d = bVar32, uStack_13e = uVar31, uStack_13f = uVar30,
                  uStack_140 = uVar29, bStack_141 = bVar28, uStack_142 = uVar27, uStack_143 = uVar26
                  , uStack_144 = uVar25, bStack_145 = bVar24, uStack_146 = uVar23,
                  uStack_147 = uVar22, local_148 = uVar21, uVar38 != 0; uVar38 = uVar38 - 1 & uVar38
                  ) {
                iVar37 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
                  }
                }
                if ((__n == *(size_t *)
                             ((long)&pbVar20[uVar42 * 0xf]._M_len + (ulong)(uint)(iVar37 << 4))) &&
                   ((__n == 0 ||
                    (iVar37 = bcmp(__s1,*(void **)((long)&pbVar20[uVar42 * 0xf]._M_str +
                                                  (ulong)(uint)(iVar37 << 4)),__n),
                    uVar45 = local_148, uVar46 = uStack_147, uVar47 = uStack_146,
                    bVar48 = bStack_145, uVar49 = uStack_144, uVar50 = uStack_143,
                    uVar51 = uStack_142, bVar52 = bStack_141, uVar53 = uStack_140,
                    uVar54 = uStack_13f, uVar55 = uStack_13e, bVar56 = bStack_13d,
                    uVar57 = uStack_13c, uVar58 = uStack_13b, uVar59 = uStack_13a,
                    bVar60 = bStack_139, iVar37 == 0)))) goto LAB_0025087e;
                uVar21 = local_148;
                uVar22 = uStack_147;
                uVar23 = uStack_146;
                bVar24 = bStack_145;
                uVar25 = uStack_144;
                uVar26 = uStack_143;
                uVar27 = uStack_142;
                bVar28 = bStack_141;
                uVar29 = uStack_140;
                uVar30 = uStack_13f;
                uVar31 = uStack_13e;
                bVar32 = bStack_13d;
                uVar33 = uStack_13c;
                uVar34 = uStack_13b;
                uVar35 = uStack_13a;
                bVar36 = bStack_139;
                uVar4 = local_148;
                uVar5 = uStack_147;
                uVar6 = uStack_146;
                bVar7 = bStack_145;
                uVar8 = uStack_144;
                uVar9 = uStack_143;
                uVar10 = uStack_142;
                bVar11 = bStack_141;
                uVar12 = uStack_140;
                uVar13 = uStack_13f;
                uVar14 = uStack_13e;
                bVar15 = bStack_13d;
                uVar16 = uStack_13c;
                uVar17 = uStack_13b;
                uVar18 = uStack_13a;
                bVar19 = bStack_139;
              }
              local_148 = uVar4;
              uStack_147 = uVar5;
              uStack_146 = uVar6;
              bStack_145 = bVar7;
              uStack_144 = uVar8;
              uStack_143 = uVar9;
              uStack_142 = uVar10;
              bStack_141 = bVar11;
              uStack_140 = uVar12;
              uStack_13f = uVar13;
              uStack_13e = uVar14;
              bStack_13d = bVar15;
              uStack_13c = uVar16;
              uStack_13b = uVar17;
              uStack_13a = uVar18;
              bStack_139 = bVar19;
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[local_1b8] & bVar3) == 0) break;
              lVar40 = local_1f0 + uVar41;
              uVar41 = uVar41 + 1;
              uVar42 = lVar40 + 1U & local_1d8;
            } while (uVar41 <= local_1d8);
            if ((ulong)local_78._8_8_ < (ulong)local_78._0_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
              ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                        (&local_160,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                          *)&local_a0,(arrays_type *)local_98,local_1c0,local_200,&local_228);
              local_78._8_8_ = local_78._8_8_ + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
              ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                        (&local_160,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                          *)&local_a0,local_200,&local_228);
            }
            local_160.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                           NetSymbol::createImplicit(local_218,local_1f8,local_208);
            SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                      ((SmallVectorBase<slang::ast::Symbol_const*> *)local_1e0,(Symbol **)&local_160
                      );
LAB_0025087e:
            pcVar43 = pcVar43 + 8;
          } while (pcVar43 != local_1c8);
        }
        uVar42 = local_1d0;
        syntax = local_1e8;
        if (local_1a0[0].data_ != (pointer)local_1a0[0].firstElement) {
          operator_delete(local_1a0[0].data_);
          uVar42 = local_1d0;
          syntax = local_1e8;
        }
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 != local_210);
  }
  local_1a0[0].data_ = (pointer)parsing::Token::location(&syntax->keyword);
  this = BumpAllocator::emplace<slang::ast::NetAliasSymbol,slang::SourceLocation>
                   (&local_218->super_BumpAllocator,(SourceLocation *)local_1a0);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,local_68.scope.ptr,syntax_00);
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_(local_a0,(table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)local_98);
  return this;
}

Assistant:

NetAliasSymbol& NetAliasSymbol::fromSyntax(const ASTContext& parentContext,
                                           const syntax::NetAliasSyntax& syntax,
                                           SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> seenNames;
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& comp = context.getCompilation();
    auto& netType = context.scope->getDefaultNetType();

    for (auto expr : syntax.nets) {
        // If not explicitly disabled check for implicit nets.
        if (!netType.isError()) {
            SmallVector<const IdentifierNameSyntax*> implicitNetNames;
            Expression::findPotentiallyImplicitNets(*expr, context, implicitNetNames);

            for (auto ins : implicitNetNames) {
                if (seenNames.emplace(ins->identifier.valueText()).second)
                    implicitNets.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
            }
        }
    }

    auto result = comp.emplace<NetAliasSymbol>(syntax.keyword.location());
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);
    return *result;
}